

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

uchar * substring(uchar *s,uint start,uint end,uint *new_size)

{
  uchar *puVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = end - start;
  if (iVar3 != 0) {
    if (new_size != (uint *)0x0) {
      *new_size = iVar3 + 1;
    }
    puVar1 = (uchar *)calloc((ulong)(iVar3 + 2),1);
    for (lVar2 = 0; (uint)((ulong)start + lVar2) <= end; lVar2 = lVar2 + 1) {
      puVar1[lVar2] = s[(ulong)start + lVar2 & 0xffffffff];
    }
    return puVar1;
  }
  fatal((uchar *)"substring",(uchar *)"end-start <= 0\n");
}

Assistant:

uint8_t *substring(uint8_t *s, uint32_t start, uint32_t end, uint32_t *new_size)
{
    if (end - start <= 0)
        fatal("substring", "end-start <= 0\n");

    // size of substr + \0
    uint32_t len = end - start + 1;
    if (new_size != NULL)
        *new_size = len;

    uint8_t *ret = (uint8_t *)calloc(len + 1, sizeof(uint8_t));
    for (uint32_t i = start; i <= end; i++)
        ret[i - start] = s[i];
    return ret;
}